

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept_mdapi.cpp
# Opt level: O2

void __thiscall CLIntercept::initCustomPerfCounters(CLIntercept *this)

{
  string *metricSetSymbolName;
  string *metricsFileName;
  ofstream *os;
  bool includeMaxValues;
  uint32_t adapterIndex;
  bool bVar1;
  char cVar2;
  MDHelper *pMVar3;
  double __x;
  double dVar4;
  allocator local_61;
  string permissionString;
  string local_40;
  
  metricSetSymbolName = &(this->m_Config).DevicePerfCounterCustom;
  pMVar3 = this->m_pMDHelper;
  if (pMVar3 != (MDHelper *)0x0) goto LAB_00183ffb;
  adapterIndex = (this->m_Config).DevicePerfCounterAdapterIndex;
  includeMaxValues = (this->m_Config).DevicePerfCounterReportMax;
  permissionString._M_dataplus._M_p = (pointer)&permissionString.field_2;
  permissionString._M_string_length = 0;
  permissionString.field_2._M_local_buf[0] = '\0';
  bVar1 = OS::Services::CheckMDAPIPermissions(&this->m_OS,&permissionString);
  if (!bVar1) {
    log(this,__x);
  }
  metricsFileName = &(this->m_Config).DevicePerfCounterFile;
  if ((this->m_Config).DevicePerfCounterEventBasedSampling == true) {
    pMVar3 = MetricsDiscovery::MDHelper::CreateEBS
                       (&(this->m_Config).DevicePerfCounterLibName,metricSetSymbolName,
                        metricsFileName,adapterIndex,includeMaxValues);
LAB_00183f7a:
    this->m_pMDHelper = pMVar3;
  }
  else {
    if ((this->m_Config).DevicePerfCounterTimeBasedSampling == true) {
      pMVar3 = MetricsDiscovery::MDHelper::CreateTBS
                         (&(this->m_Config).DevicePerfCounterLibName,metricSetSymbolName,
                          metricsFileName,adapterIndex,includeMaxValues);
      goto LAB_00183f7a;
    }
    pMVar3 = this->m_pMDHelper;
  }
  if (pMVar3 == (MDHelper *)0x0) {
    dVar4 = (double)std::__cxx11::string::string
                              ((string *)&local_40,"Metric Discovery failed to initialize.\n",
                               &local_61);
    log(this,dVar4);
  }
  else {
    dVar4 = (double)std::__cxx11::string::string
                              ((string *)&local_40,"Metric Discovery initialized.\n",&local_61);
    log(this,dVar4);
  }
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&permissionString);
  pMVar3 = this->m_pMDHelper;
  if (pMVar3 == (MDHelper *)0x0) {
    return;
  }
LAB_00183ffb:
  if ((this->m_Config).DevicePerfCounterTimeBasedSampling == true) {
    MetricsDiscovery::MDHelper::OpenStream
              (pMVar3,(this->m_Config).DevicePerfCounterTimeBasedSamplingPeriod * 1000,
               (this->m_Config).DevicePerfCounterTimeBasedBufferSize,0);
  }
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    std::__cxx11::string::string((string *)&permissionString,"",(allocator *)&local_40);
    std::__cxx11::string::string((string *)&local_40,sc_DumpDirectoryName,&local_61);
    OS::Services_Common::GetDumpDirectoryName
              (&(this->m_OS).super_Services_Common,&local_40,&permissionString);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::push_back((char)&permissionString);
    std::__cxx11::string::append((char *)&permissionString);
    std::__cxx11::string::append((char *)&permissionString);
    std::__cxx11::string::append((string *)&permissionString);
    std::__cxx11::string::append((char *)&permissionString);
    OS::Services_Common::MakeDumpDirectories(&(this->m_OS).super_Services_Common,&permissionString);
    if ((this->m_Config).UniqueFiles == true) {
      Utils::GetUniqueFileName(&local_40,&permissionString);
      std::__cxx11::string::operator=((string *)&permissionString,(string *)&local_40);
      std::__cxx11::string::~string((string *)&local_40);
    }
    os = &this->m_MetricDump;
    std::ofstream::open((char *)os,(_Ios_Openmode)permissionString._M_dataplus._M_p);
    MetricsDiscovery::MDHelper::PrintMetricNames(this->m_pMDHelper,(ostream *)os);
    MetricsDiscovery::MDHelper::PrintMetricUnits(this->m_pMDHelper,(ostream *)os);
    std::__cxx11::string::~string((string *)&permissionString);
  }
  return;
}

Assistant:

void CLIntercept::initCustomPerfCounters()
{
    const std::string& metricSetSymbolName = config().DevicePerfCounterCustom;
    const std::string& metricsFileName = config().DevicePerfCounterFile;
    uint32_t adapterIndex = config().DevicePerfCounterAdapterIndex;
    bool includeMaxValues = config().DevicePerfCounterReportMax;

    if( m_pMDHelper == NULL )
    {
        std::string permissionString;
        if( OS().CheckMDAPIPermissions(permissionString) == false )
        {
            log( permissionString );
        }

        if( config().DevicePerfCounterEventBasedSampling )
        {
            m_pMDHelper = MetricsDiscovery::MDHelper::CreateEBS(
                config().DevicePerfCounterLibName,
                metricSetSymbolName,
                metricsFileName,
                adapterIndex,
                includeMaxValues );
        }
        else if( config().DevicePerfCounterTimeBasedSampling )
        {
            m_pMDHelper = MetricsDiscovery::MDHelper::CreateTBS(
                config().DevicePerfCounterLibName,
                metricSetSymbolName,
                metricsFileName,
                adapterIndex,
                includeMaxValues );
        }
        else
        {
            CLI_ASSERT( 0 );
        }
        if( m_pMDHelper )
        {
            log( "Metric Discovery initialized.\n" );
        }
        else
        {
            log( "Metric Discovery failed to initialize.\n" );
        }
    }

    if( m_pMDHelper )
    {
        // Open the metric stream for time based sampling, if needed.
        if( config().DevicePerfCounterTimeBasedSampling )
        {
            uint32_t    timerNS =
                config().DevicePerfCounterTimeBasedSamplingPeriod * 1000;
            uint32_t    bufferSizeBytes =
                config().DevicePerfCounterTimeBasedBufferSize;
            m_pMDHelper->OpenStream(
                timerNS,        // timer period, in nanoseconds
                bufferSizeBytes,// buffer size in bytes, 0 = device maximum
                0 );            // pid -> sample all processes
        }

        // Get the dump directory name and create the dump file for
        // metrics, if we haven't created it already.
        if ( !m_MetricDump.is_open() )
        {
            std::string fileName = "";
            OS().GetDumpDirectoryName( sc_DumpDirectoryName, fileName );
            fileName += '/';
            fileName += sc_PerfCountersFileNamePrefix;
            fileName += "_";
            fileName += metricSetSymbolName;
            fileName += ".csv";

            OS().MakeDumpDirectories( fileName );
            if( m_Config.UniqueFiles )
            {
                fileName = Utils::GetUniqueFileName(fileName);
            }

            m_MetricDump.open( fileName.c_str(), std::ios::out | std::ios::binary );

            m_pMDHelper->PrintMetricNames( m_MetricDump );
            m_pMDHelper->PrintMetricUnits( m_MetricDump );
        }
    }
}